

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

void EvaluateEncodings_rec(DdManager *dd,DdNode *bVarsCol,int nVarsCol,int nMulti,int Level)

{
  bool bVar1;
  ulong uVar2;
  DdNode *pDVar3;
  double dVar4;
  DdNode *bVarsRem;
  int fBreak;
  DdNode *bVarTop;
  DdNode *bTempV;
  uint nMint1;
  uint nMint0;
  DdNode *bVars1;
  DdNode *bVars0;
  int nEntries;
  int k;
  int i;
  int Level_local;
  int nMulti_local;
  int nVarsCol_local;
  DdNode *bVarsCol_local;
  DdManager *dd_local;
  
  bVars0._0_4_ = 1 << ((char)Level - 1U & 0x1f);
  if (((Level <= s_MaxDepth) && (bVarsCol != dd->one)) && (s_BackTracks <= s_BackTrackLimit)) {
    s_BackTracks = s_BackTracks + 1;
    bVarTop = bVarsCol;
    k = Level;
    i = nMulti;
    Level_local = nVarsCol;
    _nMulti_local = bVarsCol;
    bVarsCol_local = &dd->sentinel;
    for (; bVarTop != *(DdNode **)(bVarsCol_local + 1); bVarTop = (bVarTop->type).kids.T) {
      pDVar3 = *(DdNode **)(&(bVarsCol_local[8].type.kids.E)->index + (ulong)bVarTop->index * 2);
      s_VarOrderCur[k + -1] = bVarTop->index;
      bVar1 = false;
      for (nEntries = 0; nEntries < (int)bVars0; nEntries = nEntries + 1) {
        bVars1 = ComputeVarSetAndCountMinterms
                           ((DdManager *)bVarsCol_local,s_Field[k + -1][nEntries],
                            (DdNode *)((ulong)pDVar3 ^ 1),(uint *)((long)&bTempV + 4));
        Cudd_Ref(bVars1);
        uVar2 = (ulong)bTempV._4_4_;
        dVar4 = Extra_Power2(i + -1);
        if (dVar4 < (double)uVar2) {
          Cudd_RecursiveDeref((DdManager *)bVarsCol_local,bVars1);
          bVar1 = true;
          break;
        }
        _nMint1 = ComputeVarSetAndCountMinterms
                            ((DdManager *)bVarsCol_local,s_Field[k + -1][nEntries],pDVar3,
                             (uint *)&bTempV);
        Cudd_Ref(_nMint1);
        uVar2 = (ulong)(uint)bTempV;
        dVar4 = Extra_Power2(i + -1);
        if (dVar4 < (double)uVar2) {
          Cudd_RecursiveDeref((DdManager *)bVarsCol_local,bVars1);
          Cudd_RecursiveDeref((DdManager *)bVarsCol_local,_nMint1);
          bVar1 = true;
          break;
        }
        s_Field[k][nEntries << 1] = bVars1;
        s_Field[k][nEntries * 2 + 1] = _nMint1;
      }
      if (!bVar1) {
        if (s_nVarsBest < k) {
          s_nVarsBest = k;
          for (bVars0._4_4_ = 0; bVars0._4_4_ < k; bVars0._4_4_ = bVars0._4_4_ + 1) {
            s_VarOrderBest[bVars0._4_4_] = s_VarOrderCur[bVars0._4_4_];
          }
        }
        if (0 < i + -1) {
          pDVar3 = Cudd_bddExistAbstract((DdManager *)bVarsCol_local,_nMulti_local,pDVar3);
          Cudd_Ref(pDVar3);
          EvaluateEncodings_rec((DdManager *)bVarsCol_local,pDVar3,Level_local + -1,i + -1,k + 1);
          Cudd_RecursiveDeref((DdManager *)bVarsCol_local,pDVar3);
        }
      }
      for (bVars0._4_4_ = 0; bVars0._4_4_ < nEntries; bVars0._4_4_ = bVars0._4_4_ + 1) {
        Cudd_RecursiveDeref((DdManager *)bVarsCol_local,s_Field[k][bVars0._4_4_ << 1]);
        Cudd_RecursiveDeref((DdManager *)bVarsCol_local,s_Field[k][bVars0._4_4_ * 2 + 1]);
      }
      if (s_nVarsBest == s_MaxDepth) {
        return;
      }
      if (s_nVarsBest == s_MultiStart) {
        return;
      }
    }
  }
  return;
}

Assistant:

void EvaluateEncodings_rec( DdManager * dd, DdNode * bVarsCol, int nVarsCol, int nMulti, int Level )
// bVarsCol is the set of remaining variables
// nVarsCol is the number of remaining variables
// nMulti is the number of encoding variables to be used
// Level is the level of recursion, from which this function is called
// if we successfully finish this procedure, Level also stands for how many encoding variabled we saved
{
    int i, k;
    int nEntries = (1<<(Level-1)); // the number of entries in the field of the previous level
    DdNode * bVars0, * bVars1; // the cofactors
    unsigned nMint0, nMint1;   // the number of minterms
    DdNode * bTempV;
    DdNode * bVarTop;
    int fBreak;


    // there is no need to search above this level
    if ( Level > s_MaxDepth )
        return;

    // if there are no variables left, quit the research
    if ( bVarsCol == b1 )
        return;

    if ( s_BackTracks > s_BackTrackLimit )
        return;

    s_BackTracks++;

    // otherwise, go through the remaining variables
    for ( bTempV = bVarsCol; bTempV != b1; bTempV = cuddT(bTempV) )
    {
        // the currently tested variable
        bVarTop = dd->vars[bTempV->index];

        // put it into the array
        s_VarOrderCur[Level-1] = bTempV->index;

        // go through the entries and fill them out by cofactoring
        fBreak = 0;
        for ( i = 0; i < nEntries; i++ )
        {
            bVars0 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], Cudd_Not(bVarTop), &nMint0 );
            Cudd_Ref( bVars0 );

            if ( nMint0 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                fBreak = 1;
                break;
            }

            bVars1 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], bVarTop, &nMint1 );
            Cudd_Ref( bVars1 );

            if ( nMint1 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                Cudd_RecursiveDeref( dd, bVars1 );
                fBreak = 1;
                break;
            }

            // otherwise, add these two cofactors
            s_Field[Level][2*i + 0] = bVars0; // takes ref
            s_Field[Level][2*i + 1] = bVars1; // takes ref
        } 

        if ( !fBreak )
        {
            DdNode * bVarsRem;
            // if we ended up here, it means that the cofactors w.r.t. variable bVarTop satisfy the condition
            // save this situation
            if ( s_nVarsBest < Level )
            {
                s_nVarsBest = Level;
                // copy the variable assignment
                for ( k = 0; k < Level; k++ )
                    s_VarOrderBest[k] = s_VarOrderCur[k];
            }

            // call recursively
            // get the new variable set
            if ( nMulti-1 > 0 )
            {
                bVarsRem = Cudd_bddExistAbstract( dd, bVarsCol, bVarTop );   Cudd_Ref( bVarsRem );
                EvaluateEncodings_rec( dd, bVarsRem, nVarsCol-1, nMulti-1, Level+1 );
                Cudd_RecursiveDeref( dd, bVarsRem );
            }
        }

        // deref the contents of the array
        for ( k = 0; k < i; k++ )
        {
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 0] );
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 1] );
        }

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MaxDepth )
            return;

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MultiStart )
            return;
    }
    // at this point, we have tried all possible directions in the space of variables
}